

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptutil.cpp
# Opt level: O2

void __thiscall
ScriptUtil_CreateMultisigRedeemScriptTest_Test::TestBody
          (ScriptUtil_CreateMultisigRedeemScriptTest_Test *this)

{
  undefined8 lhs;
  long lVar1;
  char *message;
  pointer pMVar2;
  initializer_list<cfd::core::Pubkey> __l;
  initializer_list<cfd::core::Pubkey> __l_00;
  initializer_list<cfd::core::Pubkey> __l_01;
  initializer_list<cfd::core::Pubkey> __l_02;
  initializer_list<cfd::core::Pubkey> __l_03;
  initializer_list<cfd::core::Pubkey> __l_04;
  initializer_list<MultisigTestVector> __l_05;
  allocator_type local_1093;
  allocator local_1092;
  allocator local_1091;
  allocator_type local_1090;
  allocator local_108f;
  allocator local_108e;
  allocator local_108d;
  allocator local_108c;
  allocator local_108b;
  allocator local_108a;
  allocator local_1089;
  allocator local_1088;
  allocator local_1087;
  allocator local_1086;
  allocator local_1085;
  allocator local_1084;
  allocator local_1083;
  allocator local_1082;
  allocator local_1081;
  allocator local_1080;
  allocator local_107f;
  allocator local_107e;
  allocator local_107d;
  allocator local_107c;
  allocator local_107b;
  allocator local_107a;
  allocator_type local_1079;
  allocator local_1078;
  allocator local_1077;
  allocator local_1076;
  allocator local_1075;
  allocator local_1074;
  allocator local_1073;
  allocator local_1072;
  allocator local_1071;
  allocator local_1070;
  allocator local_106f;
  allocator local_106e;
  allocator local_106d;
  allocator local_106c;
  allocator local_106b;
  allocator local_106a;
  allocator local_1069;
  allocator local_1068;
  allocator_type local_1067;
  allocator local_1066;
  allocator local_1065;
  allocator local_1064;
  allocator local_1063;
  allocator local_1062;
  allocator local_1061;
  allocator local_1060;
  allocator local_105f;
  allocator local_105e;
  allocator local_105d;
  allocator local_105c;
  allocator local_105b;
  allocator local_105a;
  allocator local_1059;
  allocator local_1058;
  allocator local_1057;
  allocator local_1056;
  allocator_type local_1055;
  allocator local_1054;
  allocator local_1053;
  allocator local_1052;
  allocator local_1051;
  allocator local_1050;
  allocator_type local_104f;
  allocator local_104e;
  allocator local_104d;
  allocator local_104c;
  allocator local_104b;
  allocator_type local_104a;
  allocator local_1049;
  AssertionResult gtest_ar;
  Pubkey local_1030;
  Pubkey local_1018;
  vector<MultisigTestVector,_std::allocator<MultisigTestVector>_> test_vectors;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_fe8;
  Pubkey local_fd0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_fb8;
  string local_fa0 [32];
  string local_f80 [32];
  string local_f60 [32];
  string local_f40 [32];
  string local_f20 [32];
  string local_f00 [32];
  string local_ee0 [32];
  string local_ec0 [32];
  string local_ea0 [32];
  string local_e80 [32];
  string local_e60 [32];
  string local_e40 [32];
  string local_e20 [32];
  string local_e00 [32];
  string local_de0 [32];
  string local_dc0 [32];
  string local_da0 [32];
  string local_d80 [32];
  string local_d60 [32];
  string local_d40 [32];
  string local_d20 [32];
  string local_d00 [32];
  string local_ce0 [32];
  string local_cc0 [32];
  string local_ca0 [32];
  string local_c80 [32];
  string local_c60 [32];
  string local_c40 [32];
  string local_c20 [32];
  string local_c00 [32];
  string local_be0 [32];
  string local_bc0 [32];
  string local_ba0 [32];
  string local_b80 [32];
  string local_b60 [32];
  string local_b40 [32];
  string local_b20 [32];
  string local_b00 [32];
  string local_ae0 [32];
  string local_ac0 [32];
  string local_aa0 [32];
  string local_a80 [32];
  string local_a60 [32];
  string local_a40 [32];
  string local_a20 [32];
  string local_a00 [32];
  string local_9e0 [32];
  string local_9c0 [32];
  string local_9a0 [32];
  string local_980 [32];
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  AssertionResult gtest_ar_1;
  Pubkey local_7c8;
  Pubkey local_7b0;
  Pubkey local_798;
  Pubkey local_780;
  Pubkey local_768;
  Pubkey local_750;
  Pubkey local_738;
  Pubkey local_720;
  Pubkey local_708;
  Pubkey local_6f0;
  Pubkey local_6d8;
  Pubkey local_6c0;
  Pubkey local_6a8;
  Pubkey local_690;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_678;
  Pubkey local_660;
  Pubkey local_648;
  Pubkey local_630;
  Pubkey local_618;
  Pubkey local_600;
  Pubkey local_5e8;
  Pubkey local_5d0;
  Pubkey local_5b8;
  Pubkey local_5a0;
  Pubkey local_588;
  Pubkey local_570;
  Pubkey local_558;
  Pubkey local_540;
  Pubkey local_528;
  MultisigTestVector test_vector;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_488;
  Script local_470;
  string local_438 [32];
  undefined1 local_418;
  undefined4 local_410;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_408;
  Script local_3f0;
  string local_3b8 [32];
  undefined1 local_398;
  undefined4 local_390;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_388;
  Script local_370;
  string local_338 [32];
  undefined1 local_318;
  undefined4 local_310;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_308;
  Script local_2f0;
  string local_2b8 [32];
  undefined1 local_298;
  undefined4 local_290;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_288;
  Script local_270;
  string local_238 [32];
  undefined1 local_218;
  Script actual;
  Pubkey local_1c8;
  Pubkey local_1b0;
  Pubkey local_198;
  Pubkey local_180;
  Pubkey local_168;
  Pubkey local_150;
  Pubkey local_138;
  Pubkey local_120;
  Pubkey local_108;
  Pubkey local_f0;
  Pubkey local_d8;
  Pubkey local_c0;
  Pubkey local_a8;
  Pubkey local_90;
  Pubkey local_78;
  Pubkey local_60;
  Pubkey local_48;
  
  test_vector.req_sig = 1;
  std::__cxx11::string::string
            (local_800,"02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0",
             &local_1049);
  cfd::core::Pubkey::Pubkey((Pubkey *)&local_fb8,local_800);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_fb8;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&test_vector.input_pubkeys,__l,&local_104a);
  std::__cxx11::string::string
            (local_820,"512102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a051ae",
             &local_104b);
  cfd::core::Script::Script(&test_vector.expect_multisig_script,local_820);
  std::__cxx11::string::string((string *)&test_vector.expect_message,"",&local_104c);
  test_vector.is_witness = false;
  std::__cxx11::string::string
            (local_840,"02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0",
             &local_104d);
  cfd::core::Pubkey::Pubkey((Pubkey *)&local_fe8,local_840);
  std::__cxx11::string::string
            (local_860,"0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c",
             &local_104e);
  cfd::core::Pubkey::Pubkey(&local_fd0,local_860);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_fe8;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_488,__l_00,&local_104f);
  std::__cxx11::string::string
            (local_880,
             "512102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c52ae"
             ,&local_1050);
  cfd::core::Script::Script(&local_470,local_880);
  std::__cxx11::string::string(local_438,"",&local_1051);
  local_418 = 0;
  local_410 = 2;
  std::__cxx11::string::string
            (local_8a0,"02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0",
             &local_1052);
  cfd::core::Pubkey::Pubkey((Pubkey *)&gtest_ar,local_8a0);
  std::__cxx11::string::string
            (local_8c0,"0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c",
             &local_1053);
  cfd::core::Pubkey::Pubkey(&local_1030,local_8c0);
  std::__cxx11::string::string
            (local_8e0,"024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82",
             &local_1054);
  cfd::core::Pubkey::Pubkey(&local_1018,local_8e0);
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&gtest_ar;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_408,__l_01,&local_1055);
  std::__cxx11::string::string
            (local_900,
             "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae"
             ,&local_1056);
  cfd::core::Script::Script(&local_3f0,local_900);
  std::__cxx11::string::string(local_3b8,"",&local_1057);
  local_398 = 0;
  local_390 = 0xc;
  std::__cxx11::string::string
            (local_920,"02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0",
             &local_1058);
  cfd::core::Pubkey::Pubkey((Pubkey *)&gtest_ar_1,local_920);
  std::__cxx11::string::string
            (local_940,"0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c",
             &local_1059);
  cfd::core::Pubkey::Pubkey(&local_7c8,local_940);
  std::__cxx11::string::string
            (local_960,"024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82",
             &local_105a);
  cfd::core::Pubkey::Pubkey(&local_7b0,local_960);
  std::__cxx11::string::string
            (local_980,"03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38",
             &local_105b);
  cfd::core::Pubkey::Pubkey(&local_798,local_980);
  std::__cxx11::string::string
            (local_9a0,"020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1",
             &local_105c);
  cfd::core::Pubkey::Pubkey(&local_780,local_9a0);
  std::__cxx11::string::string
            (local_9c0,"0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147",
             &local_105d);
  cfd::core::Pubkey::Pubkey(&local_768,local_9c0);
  std::__cxx11::string::string
            (local_9e0,"0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c",
             &local_105e);
  cfd::core::Pubkey::Pubkey(&local_750,local_9e0);
  std::__cxx11::string::string
            (local_a00,"020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9",
             &local_105f);
  cfd::core::Pubkey::Pubkey(&local_738,local_a00);
  std::__cxx11::string::string
            (local_a20,"0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37",
             &local_1060);
  cfd::core::Pubkey::Pubkey(&local_720,local_a20);
  std::__cxx11::string::string
            (local_a40,"0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e",
             &local_1061);
  cfd::core::Pubkey::Pubkey(&local_708,local_a40);
  std::__cxx11::string::string
            (local_a60,"03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b",
             &local_1062);
  cfd::core::Pubkey::Pubkey(&local_6f0,local_a60);
  std::__cxx11::string::string
            (local_a80,"02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd",
             &local_1063);
  cfd::core::Pubkey::Pubkey(&local_6d8,local_a80);
  std::__cxx11::string::string
            (local_aa0,"0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d",
             &local_1064);
  cfd::core::Pubkey::Pubkey(&local_6c0,local_aa0);
  std::__cxx11::string::string
            (local_ac0,"0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2",
             &local_1065);
  cfd::core::Pubkey::Pubkey(&local_6a8,local_ac0);
  std::__cxx11::string::string
            (local_ae0,"025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db",
             &local_1066);
  cfd::core::Pubkey::Pubkey(&local_690,local_ae0);
  __l_02._M_len = 0xf;
  __l_02._M_array = (iterator)&gtest_ar_1;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_388,__l_02,&local_1067);
  std::__cxx11::string::string
            (local_b00,
             "5c2102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b822103ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb3821020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1210289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147210210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c21020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9210289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37210254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e2103a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b2102ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd210289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d210396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd221025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db5fae"
             ,&local_1068);
  cfd::core::Script::Script(&local_370,local_b00);
  std::__cxx11::string::string(local_338,"",&local_1069);
  local_318 = 0;
  local_310 = 0xf;
  std::__cxx11::string::string
            (local_b20,"02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0",
             &local_106a);
  cfd::core::Pubkey::Pubkey((Pubkey *)&local_678,local_b20);
  std::__cxx11::string::string
            (local_b40,"0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c",
             &local_106b);
  cfd::core::Pubkey::Pubkey(&local_660,local_b40);
  std::__cxx11::string::string
            (local_b60,"024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82",
             &local_106c);
  cfd::core::Pubkey::Pubkey(&local_648,local_b60);
  std::__cxx11::string::string
            (local_b80,"03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38",
             &local_106d);
  cfd::core::Pubkey::Pubkey(&local_630,local_b80);
  std::__cxx11::string::string
            (local_ba0,"020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1",
             &local_106e);
  cfd::core::Pubkey::Pubkey(&local_618,local_ba0);
  std::__cxx11::string::string
            (local_bc0,"0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147",
             &local_106f);
  cfd::core::Pubkey::Pubkey(&local_600,local_bc0);
  std::__cxx11::string::string
            (local_be0,"0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c",
             &local_1070);
  cfd::core::Pubkey::Pubkey(&local_5e8,local_be0);
  std::__cxx11::string::string
            (local_c00,"020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9",
             &local_1071);
  cfd::core::Pubkey::Pubkey(&local_5d0,local_c00);
  std::__cxx11::string::string
            (local_c20,"0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37",
             &local_1072);
  cfd::core::Pubkey::Pubkey(&local_5b8,local_c20);
  std::__cxx11::string::string
            (local_c40,"0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e",
             &local_1073);
  cfd::core::Pubkey::Pubkey(&local_5a0,local_c40);
  std::__cxx11::string::string
            (local_c60,"03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b",
             &local_1074);
  cfd::core::Pubkey::Pubkey(&local_588,local_c60);
  std::__cxx11::string::string
            (local_c80,"02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd",
             &local_1075);
  cfd::core::Pubkey::Pubkey(&local_570,local_c80);
  std::__cxx11::string::string
            (local_ca0,"0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d",
             &local_1076);
  cfd::core::Pubkey::Pubkey(&local_558,local_ca0);
  std::__cxx11::string::string
            (local_cc0,"0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2",
             &local_1077);
  cfd::core::Pubkey::Pubkey(&local_540,local_cc0);
  std::__cxx11::string::string
            (local_ce0,"025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db",
             &local_1078);
  cfd::core::Pubkey::Pubkey(&local_528,local_ce0);
  __l_03._M_len = 0xf;
  __l_03._M_array = (iterator)&local_678;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_308,__l_03,&local_1079);
  std::__cxx11::string::string
            (local_d00,
             "5f2102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b822103ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb3821020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1210289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147210210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c21020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9210289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37210254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e2103a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b2102ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd210289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d210396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd221025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db5fae"
             ,&local_107a);
  cfd::core::Script::Script(&local_2f0,local_d00);
  std::__cxx11::string::string(local_2b8,"",&local_107b);
  local_298 = 0;
  local_290 = 0x14;
  std::__cxx11::string::string
            (local_d20,"02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0",
             &local_107c);
  cfd::core::Pubkey::Pubkey((Pubkey *)&actual,local_d20);
  std::__cxx11::string::string
            (local_d40,"0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c",
             &local_107d);
  cfd::core::Pubkey::Pubkey
            ((Pubkey *)
             &actual.script_data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_d40);
  std::__cxx11::string::string
            (local_d60,"024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82",
             &local_107e);
  cfd::core::Pubkey::Pubkey
            ((Pubkey *)
             &actual.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_d60);
  std::__cxx11::string::string
            (local_d80,"03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38",
             &local_107f);
  cfd::core::Pubkey::Pubkey(&local_1c8,local_d80);
  std::__cxx11::string::string
            (local_da0,"020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1",
             &local_1080);
  cfd::core::Pubkey::Pubkey(&local_1b0,local_da0);
  std::__cxx11::string::string
            (local_dc0,"0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147",
             &local_1081);
  cfd::core::Pubkey::Pubkey(&local_198,local_dc0);
  std::__cxx11::string::string
            (local_de0,"0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c",
             &local_1082);
  cfd::core::Pubkey::Pubkey(&local_180,local_de0);
  std::__cxx11::string::string
            (local_e00,"020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9",
             &local_1083);
  cfd::core::Pubkey::Pubkey(&local_168,local_e00);
  std::__cxx11::string::string
            (local_e20,"0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37",
             &local_1084);
  cfd::core::Pubkey::Pubkey(&local_150,local_e20);
  std::__cxx11::string::string
            (local_e40,"0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e",
             &local_1085);
  cfd::core::Pubkey::Pubkey(&local_138,local_e40);
  std::__cxx11::string::string
            (local_e60,"03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b",
             &local_1086);
  cfd::core::Pubkey::Pubkey(&local_120,local_e60);
  std::__cxx11::string::string
            (local_e80,"02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd",
             &local_1087);
  cfd::core::Pubkey::Pubkey(&local_108,local_e80);
  std::__cxx11::string::string
            (local_ea0,"0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d",
             &local_1088);
  cfd::core::Pubkey::Pubkey(&local_f0,local_ea0);
  std::__cxx11::string::string
            (local_ec0,"0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2",
             &local_1089);
  cfd::core::Pubkey::Pubkey(&local_d8,local_ec0);
  std::__cxx11::string::string
            (local_ee0,"025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db",
             &local_108a);
  cfd::core::Pubkey::Pubkey(&local_c0,local_ee0);
  std::__cxx11::string::string
            (local_f00,"030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55",
             &local_108b);
  cfd::core::Pubkey::Pubkey(&local_a8,local_f00);
  std::__cxx11::string::string
            (local_f20,"0267a49281bd9d6d366c39c62f2e95a2aab37638f2a4718891c542d0961962644e",
             &local_108c);
  cfd::core::Pubkey::Pubkey(&local_90,local_f20);
  std::__cxx11::string::string
            (local_f40,"02f48e8e2bcaeb16a6d781bb7a72f6250607bf21e32f08c48e37a9e4706e6d48b8",
             &local_108d);
  cfd::core::Pubkey::Pubkey(&local_78,local_f40);
  std::__cxx11::string::string
            (local_f60,"03968ac57888ddaa3b57caa39efd5d5382c24f3deed602775cd4895f7c7adb5950",
             &local_108e);
  cfd::core::Pubkey::Pubkey(&local_60,local_f60);
  std::__cxx11::string::string
            (local_f80,"024b64115bff6cc3718867114f7594fad535344f27ebe17ffa0e66288eb7bd2561",
             &local_108f);
  cfd::core::Pubkey::Pubkey(&local_48,local_f80);
  __l_04._M_len = 0x14;
  __l_04._M_array = (iterator)&actual;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_288,__l_04,&local_1090);
  std::__cxx11::string::string
            (local_fa0,
             "01142102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b822103ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb3821020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1210289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147210210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c21020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9210289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37210254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e2103a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b2102ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd210289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d210396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd221025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db21030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55210267a49281bd9d6d366c39c62f2e95a2aab37638f2a4718891c542d0961962644e2102f48e8e2bcaeb16a6d781bb7a72f6250607bf21e32f08c48e37a9e4706e6d48b82103968ac57888ddaa3b57caa39efd5d5382c24f3deed602775cd4895f7c7adb595021024b64115bff6cc3718867114f7594fad535344f27ebe17ffa0e66288eb7bd25610114ae"
             ,&local_1091);
  cfd::core::Script::Script(&local_270,local_fa0);
  std::__cxx11::string::string(local_238,"",&local_1092);
  local_218 = 1;
  __l_05._M_len = 6;
  __l_05._M_array = &test_vector;
  std::vector<MultisigTestVector,_std::allocator<MultisigTestVector>_>::vector
            (&test_vectors,__l_05,&local_1093);
  lVar1 = 0x280;
  do {
    MultisigTestVector::~MultisigTestVector
              ((MultisigTestVector *)((long)&test_vector.req_sig + lVar1));
    lVar1 = lVar1 + -0x80;
  } while (lVar1 != -0x80);
  std::__cxx11::string::~string(local_fa0);
  lVar1 = 0x1c8;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&actual._vptr_Script + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  std::__cxx11::string::~string(local_f80);
  std::__cxx11::string::~string(local_f60);
  std::__cxx11::string::~string(local_f40);
  std::__cxx11::string::~string(local_f20);
  std::__cxx11::string::~string(local_f00);
  std::__cxx11::string::~string(local_ee0);
  std::__cxx11::string::~string(local_ec0);
  std::__cxx11::string::~string(local_ea0);
  std::__cxx11::string::~string(local_e80);
  std::__cxx11::string::~string(local_e60);
  std::__cxx11::string::~string(local_e40);
  std::__cxx11::string::~string(local_e20);
  std::__cxx11::string::~string(local_e00);
  std::__cxx11::string::~string(local_de0);
  std::__cxx11::string::~string(local_dc0);
  std::__cxx11::string::~string(local_da0);
  std::__cxx11::string::~string(local_d80);
  std::__cxx11::string::~string(local_d60);
  std::__cxx11::string::~string(local_d40);
  std::__cxx11::string::~string(local_d20);
  std::__cxx11::string::~string(local_d00);
  lVar1 = 0x150;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&local_678._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  std::__cxx11::string::~string(local_ce0);
  std::__cxx11::string::~string(local_cc0);
  std::__cxx11::string::~string(local_ca0);
  std::__cxx11::string::~string(local_c80);
  std::__cxx11::string::~string(local_c60);
  std::__cxx11::string::~string(local_c40);
  std::__cxx11::string::~string(local_c20);
  std::__cxx11::string::~string(local_c00);
  std::__cxx11::string::~string(local_be0);
  std::__cxx11::string::~string(local_bc0);
  std::__cxx11::string::~string(local_ba0);
  std::__cxx11::string::~string(local_b80);
  std::__cxx11::string::~string(local_b60);
  std::__cxx11::string::~string(local_b40);
  std::__cxx11::string::~string(local_b20);
  std::__cxx11::string::~string(local_b00);
  lVar1 = 0x150;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               (&gtest_ar_1.success_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  std::__cxx11::string::~string(local_ae0);
  std::__cxx11::string::~string(local_ac0);
  std::__cxx11::string::~string(local_aa0);
  std::__cxx11::string::~string(local_a80);
  std::__cxx11::string::~string(local_a60);
  std::__cxx11::string::~string(local_a40);
  std::__cxx11::string::~string(local_a20);
  std::__cxx11::string::~string(local_a00);
  std::__cxx11::string::~string(local_9e0);
  std::__cxx11::string::~string(local_9c0);
  std::__cxx11::string::~string(local_9a0);
  std::__cxx11::string::~string(local_980);
  std::__cxx11::string::~string(local_960);
  std::__cxx11::string::~string(local_940);
  std::__cxx11::string::~string(local_920);
  std::__cxx11::string::~string(local_900);
  lVar1 = 0x30;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               (&gtest_ar.success_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  std::__cxx11::string::~string(local_8e0);
  std::__cxx11::string::~string(local_8c0);
  std::__cxx11::string::~string(local_8a0);
  std::__cxx11::string::~string(local_880);
  lVar1 = 0x18;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&local_fe8._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  std::__cxx11::string::~string(local_860);
  std::__cxx11::string::~string(local_840);
  std::__cxx11::string::~string(local_820);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_fb8);
  std::__cxx11::string::~string(local_800);
  cfd::core::Script::Script(&actual);
  for (pMVar2 = test_vectors.
                super__Vector_base<MultisigTestVector,_std::allocator<MultisigTestVector>_>._M_impl.
                super__Vector_impl_data._M_start;
      pMVar2 != test_vectors.
                super__Vector_base<MultisigTestVector,_std::allocator<MultisigTestVector>_>._M_impl.
                super__Vector_impl_data._M_finish; pMVar2 = pMVar2 + 1) {
    MultisigTestVector::MultisigTestVector(&test_vector,pMVar2);
    cfd::core::ScriptUtil::CreateMultisigRedeemScript
              ((uint)(Script *)&gtest_ar_1,(vector *)(ulong)test_vector.req_sig,
               (bool)((char)&test_vector + '\b'));
    cfd::core::Script::operator=(&actual,(Script *)&gtest_ar_1);
    cfd::core::Script::~Script((Script *)&gtest_ar_1);
    cfd::core::Script::GetHex_abi_cxx11_();
    lhs = gtest_ar_1._0_8_;
    cfd::core::Script::GetHex_abi_cxx11_();
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"actual.GetHex().c_str()",
               "test_vector.expect_multisig_script.GetHex().c_str()",(char *)lhs,
               (char *)local_678._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::~string((string *)&local_678);
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      message = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_678,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x127,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_678,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_678);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    MultisigTestVector::~MultisigTestVector(&test_vector);
  }
  cfd::core::Script::~Script(&actual);
  std::vector<MultisigTestVector,_std::allocator<MultisigTestVector>_>::~vector(&test_vectors);
  return;
}

Assistant:

TEST(ScriptUtil, CreateMultisigRedeemScriptTest) {
  const std::vector<MultisigTestVector> test_vectors = {
    // 1-of-1 Multisig
    {
      1,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
      },
      Script("512102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a051ae"),
      "",
      false
    },
    // 1-of-2 Multisig
    {
      1,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
      },
      Script("512102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c52ae"),
      "",
      false
    },
    // 2-of-3 Multisig
    {
      2,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
        Pubkey("024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82"),
      },
      Script("522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae"),
      "",
      false
    },
    // 12-of-15 Multisig
    {
      12,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
        Pubkey("024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82"),
        Pubkey("03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38"),
        Pubkey("020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1"),
        Pubkey("0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147"),
        Pubkey("0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c"),
        Pubkey("020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9"),
        Pubkey("0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37"),
        Pubkey("0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e"),
        Pubkey("03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b"),
        Pubkey("02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd"),
        Pubkey("0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d"),
        Pubkey("0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2"),
        Pubkey("025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db"),
      },
      Script("5c2102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b822103ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb3821020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1210289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147210210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c21020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9210289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37210254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e2103a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b2102ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd210289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d210396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd221025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db5fae"),
      "",
      false
    },
    // 15-of-15 Multisig
    {
      15,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
        Pubkey("024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82"),
        Pubkey("03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38"),
        Pubkey("020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1"),
        Pubkey("0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147"),
        Pubkey("0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c"),
        Pubkey("020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9"),
        Pubkey("0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37"),
        Pubkey("0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e"),
        Pubkey("03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b"),
        Pubkey("02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd"),
        Pubkey("0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d"),
        Pubkey("0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2"),
        Pubkey("025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db"),
      },
      Script("5f2102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b822103ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb3821020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1210289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147210210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c21020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9210289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37210254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e2103a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b2102ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd210289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d210396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd221025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db5fae"),
      "",
      false
    },
    // 20-of-20 Multisig on witness
    {
      20,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
        Pubkey("024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82"),
        Pubkey("03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38"),
        Pubkey("020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1"),
        Pubkey("0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147"),
        Pubkey("0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c"),
        Pubkey("020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9"),
        Pubkey("0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37"),
        Pubkey("0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e"),
        Pubkey("03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b"),
        Pubkey("02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd"),
        Pubkey("0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d"),
        Pubkey("0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2"),
        Pubkey("025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db"),
        Pubkey("030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55"),
        Pubkey("0267a49281bd9d6d366c39c62f2e95a2aab37638f2a4718891c542d0961962644e"),
        Pubkey("02f48e8e2bcaeb16a6d781bb7a72f6250607bf21e32f08c48e37a9e4706e6d48b8"),
        Pubkey("03968ac57888ddaa3b57caa39efd5d5382c24f3deed602775cd4895f7c7adb5950"),
        Pubkey("024b64115bff6cc3718867114f7594fad535344f27ebe17ffa0e66288eb7bd2561"),
      },
      Script("01142102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b822103ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb3821020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1210289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147210210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c21020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9210289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37210254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e2103a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b2102ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd210289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d210396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd221025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db21030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55210267a49281bd9d6d366c39c62f2e95a2aab37638f2a4718891c542d0961962644e2102f48e8e2bcaeb16a6d781bb7a72f6250607bf21e32f08c48e37a9e4706e6d48b82103968ac57888ddaa3b57caa39efd5d5382c24f3deed602775cd4895f7c7adb595021024b64115bff6cc3718867114f7594fad535344f27ebe17ffa0e66288eb7bd25610114ae"),
      "",
      true
    },
  };

  Script actual;
  for (MultisigTestVector test_vector : test_vectors) {
    try {
      actual = ScriptUtil::CreateMultisigRedeemScript(
          test_vector.req_sig, test_vector.input_pubkeys,
          test_vector.is_witness);
      EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_multisig_script.GetHex().c_str());
    } catch (const CfdException& except) {
      EXPECT_STREQ(except.what(), "");
      EXPECT_EQ(test_vector.req_sig, 0);
    }
  }
}